

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O3

sexp_conflict
sexp_termios_set_c_iflag
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict v)

{
  sexp_conflict psVar1;
  sexp_tag_t sVar2;
  
  if (((ulong)x & 3) != 0) {
    psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,(long)(self->value).type.id >> 1);
    return psVar1;
  }
  if ((long)(self->value).type.id >> 1 == (ulong)x->tag) {
    if (((ulong)v & 1) == 0) {
      if ((((ulong)v & 2) != 0) || (v->tag != 0xc)) {
        psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2,v);
        return psVar1;
      }
      sVar2 = (sexp_tag_t)(v->value).uvector.length;
    }
    else {
      sVar2 = (sexp_tag_t)((long)v >> 1);
    }
    ((x->value).type.slots)->tag = sVar2;
    return (sexp_conflict)0x43e;
  }
  psVar1 = (sexp_conflict)sexp_type_exception();
  return psVar1;
}

Assistant:

sexp sexp_termios_set_c_iflag (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp v) {
  if (! (sexp_pointerp(x) && (sexp_pointer_tag(x) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), x);
  if (! sexp_exact_integerp(v))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, v);
  ((struct termios*)sexp_cpointer_value(x))->c_iflag = sexp_uint_value(v);
  return SEXP_VOID;
}